

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::GTestLog::~GTestLog(GTestLog *this)

{
  ostream *this_00;
  GTestLog *this_local;
  
  this_00 = GetStream(this);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  if (this->severity_ == GTEST_FATAL) {
    fflush(_stderr);
    posix::Abort();
  }
  return;
}

Assistant:

GTestLog::~GTestLog() {
  GetStream() << ::std::endl;
  if (severity_ == GTEST_FATAL) {
    fflush(stderr);
    posix::Abort();
  }
}